

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  cmState *this_00;
  cmValue str;
  char *pcVar5;
  string_view str_00;
  string_view str_01;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  if (key == (char *)0x0) {
    pcVar5 = ExpandVariable(this,var);
    return pcVar5;
  }
  if (var == (char *)0x0) {
    return "";
  }
  iVar3 = strcmp(key,"ENV");
  if (iVar3 == 0) {
    local_1a0._8_8_ = 0;
    local_190[0]._M_local_buf[0] = '\0';
    local_1a0._0_8_ = local_1a0 + 0x10;
    bVar2 = cmsys::SystemTools::GetEnv(var,(string *)local_1a0);
    if (bVar2) {
      if (this->EscapeQuotes == true) {
        str_00._M_str = (char *)local_1a0._0_8_;
        str_00._M_len = local_1a0._8_8_;
        cmEscapeQuotes_abi_cxx11_(&local_1c0,str_00);
        pcVar5 = AddString(this,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pcVar5 = AddString(this,(string *)local_1a0);
      }
    }
    else {
      pcVar5 = "";
    }
    if ((undefined1 *)local_1a0._0_8_ == local_1a0 + 0x10) {
      return pcVar5;
    }
  }
  else {
    iVar3 = strcmp(key,"CACHE");
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Syntax $",8);
      sVar4 = strlen(key);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,key,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"{} is not supported.  ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Only ${}, $ENV{}, and $CACHE{} are allowed.",0x2b);
      std::__cxx11::stringbuf::str();
      if ((this->ErrorString)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ErrorString);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    pp_Var1 = (_func_int **)(local_1a0 + 0x10);
    local_1a0._0_8_ = pp_Var1;
    sVar4 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,var,var + sVar4);
    str = cmState::GetInitializedCacheValue(this_00,(string *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0]
                              ) + 1);
    }
    if (str.Value == (string *)0x0) {
      return "";
    }
    if (this->EscapeQuotes != true) {
      pcVar5 = AddString(this,str.Value);
      return pcVar5;
    }
    str_01._M_str = ((str.Value)->_M_dataplus)._M_p;
    str_01._M_len = (str.Value)->_M_string_length;
    cmEscapeQuotes_abi_cxx11_((string *)local_1a0,str_01);
    pcVar5 = AddString(this,(string *)local_1a0);
    if ((_func_int **)local_1a0._0_8_ == pp_Var1) {
      return pcVar5;
    }
  }
  operator_delete((void *)local_1a0._0_8_,
                  CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0]) +
                  1);
  return pcVar5;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandSpecialVariable(
  const char* key, const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return "";
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return "";
  }
  if (strcmp(key, "CACHE") == 0) {
    if (cmValue c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(*c));
      }
      return this->AddString(*c);
    }
    return "";
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return nullptr;
}